

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O1

void ncnn::transpose_pack_A_tile_int8_avxvnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  uint uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong *puVar25;
  undefined1 *puVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_ZMM4 [64];
  long local_88;
  long local_50;
  
  auVar37 = in_ZMM4._0_16_;
  iVar7 = cpu_support_x86_avx_vnni_int8();
  if (iVar7 != 0) {
    transpose_pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  iVar7 = A->w;
  lVar9 = (long)iVar7;
  pauVar10 = (undefined1 (*) [16])AT->data;
  uVar24 = 0;
  lVar12 = (long)k;
  lVar22 = (long)i;
  if (7 < max_ii) {
    lVar20 = iVar7 * 3 + lVar22;
    lVar23 = lVar22 + iVar7 * 2;
    lVar32 = lVar9 + lVar22;
    lVar28 = lVar22;
    uVar19 = 0;
    do {
      pvVar6 = A->data;
      lVar30 = A->w * lVar12 * A->elemsize;
      if (3 < max_kk) {
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)pvVar6 + lVar30 + lVar28);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)pvVar6 + lVar30 + lVar32);
        auVar37 = vpunpcklbw_avx(auVar37,auVar39);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)((long)pvVar6 + lVar30 + lVar23);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)((long)pvVar6 + lVar30 + lVar20);
        auVar39 = vpunpcklbw_avx(auVar40,auVar41);
        vpunpcklwd_avx(auVar37,auVar39);
        vpunpckhwd_avx(auVar37,auVar39);
        halt_baddata();
      }
      puVar25 = (ulong *)((long)pvVar6 + lVar30 + lVar22 + uVar19);
      iVar14 = 0;
      if (3 < max_kk) {
        *(undefined8 *)*pauVar10 = 0;
        *(undefined8 *)(*pauVar10 + 8) = 0;
        *(undefined8 *)pauVar10[1] = 0;
        *(undefined8 *)(pauVar10[1] + 8) = 0;
        pauVar10 = pauVar10 + 2;
      }
      iVar16 = iVar14;
      if (1 < max_kk) {
        do {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *puVar25;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)((long)puVar25 + lVar9);
          auVar39 = vpunpcklbw_avx(auVar36,auVar38);
          *pauVar10 = auVar39;
          pauVar10 = pauVar10 + 1;
          puVar25 = (ulong *)((long)puVar25 + (long)(iVar7 * 2));
          iVar14 = iVar16 + 2;
          iVar29 = iVar16 + 3;
          iVar16 = iVar14;
        } while (iVar29 < max_kk);
      }
      iVar16 = max_kk - iVar14;
      if (iVar16 != 0 && iVar14 <= max_kk) {
        do {
          *(ulong *)*pauVar10 = *puVar25;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 8);
          puVar25 = (ulong *)((long)puVar25 + lVar9);
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      uVar24 = uVar19 + 8;
      uVar33 = uVar19 + 0xf;
      lVar28 = lVar28 + 8;
      lVar20 = lVar20 + 8;
      lVar23 = lVar23 + 8;
      lVar32 = lVar32 + 8;
      uVar19 = uVar24;
    } while (uVar33 < (uint)max_ii);
  }
  auVar39 = _DAT_005f1640;
  lVar32 = (long)max_ii;
  if ((int)((uint)uVar24 | 3) < max_ii) {
    auVar35._4_4_ = iVar7;
    auVar35._0_4_ = iVar7;
    auVar35._8_4_ = iVar7;
    auVar35._12_4_ = iVar7;
    vpmulld_avx(auVar35,_DAT_005f10d0);
    uVar19 = uVar24 & 0xffffffff;
    do {
      puVar26 = (undefined1 *)((long)A->data + lVar22 + uVar19 + A->w * lVar12 * A->elemsize);
      iVar14 = 0;
      if (3 < max_kk) {
        auVar37 = vpcmpeqd_avx(auVar37,auVar37);
        auVar37 = vpgatherdd((undefined1  [16])0x0,auVar37);
        vpshufb_avx(auVar37,auVar39);
        halt_baddata();
      }
      if (3 < max_kk) {
        *pauVar10 = (undefined1  [16])0x0;
        pauVar10 = pauVar10 + 1;
      }
      iVar16 = iVar14;
      if (1 < max_kk) {
        do {
          (*pauVar10)[0] = *puVar26;
          (*pauVar10)[1] = puVar26[lVar9];
          (*pauVar10)[2] = puVar26[1];
          (*pauVar10)[3] = puVar26[iVar7 + 1];
          (*pauVar10)[4] = puVar26[2];
          (*pauVar10)[5] = puVar26[iVar7 + 2];
          (*pauVar10)[6] = puVar26[3];
          (*pauVar10)[7] = puVar26[iVar7 + 3];
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 8);
          puVar26 = puVar26 + lVar9 * 2;
          iVar14 = iVar16 + 2;
          iVar29 = iVar16 + 3;
          iVar16 = iVar14;
        } while (iVar29 < max_kk);
      }
      iVar16 = max_kk - iVar14;
      if (iVar16 != 0 && iVar14 <= max_kk) {
        puVar26 = puVar26 + 3;
        do {
          (*pauVar10)[0] = puVar26[-3];
          (*pauVar10)[1] = puVar26[-2];
          (*pauVar10)[2] = puVar26[-1];
          (*pauVar10)[3] = *puVar26;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 4);
          puVar26 = puVar26 + lVar9;
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      uVar24 = uVar19 + 4;
      lVar28 = uVar19 + 7;
      uVar19 = uVar24;
    } while (lVar28 < lVar32);
  }
  if ((int)((uint)uVar24 | 1) < max_ii) {
    lVar34 = (long)(iVar7 * 4);
    lVar28 = lVar22 + (uVar24 & 0xffffffff);
    lVar23 = (iVar7 * 3 + 1) + lVar28;
    lVar20 = lVar28 + (iVar7 + 1);
    lVar30 = iVar7 * 3 + lVar28;
    local_88 = lVar28 + iVar7 * 2;
    local_50 = lVar28 + lVar9;
    uVar19 = uVar24 & 0xffffffff;
    do {
      pvVar6 = A->data;
      lVar27 = A->w * lVar12 * A->elemsize;
      if (max_kk < 4) {
        lVar21 = (long)pvVar6 + lVar22 + uVar19;
        uVar11 = 0;
        iVar14 = 0;
        iVar16 = 0;
      }
      else {
        lVar21 = (long)pvVar6 + lVar28;
        lVar15 = (long)pvVar6 + lVar23;
        lVar17 = (long)pvVar6 + lVar20;
        lVar18 = (long)pvVar6 + lVar30;
        lVar31 = (long)pvVar6 + local_88;
        lVar13 = (long)pvVar6 + local_50;
        iVar16 = 0;
        iVar29 = 3;
        iVar14 = 0;
        do {
          cVar1 = *(char *)(lVar21 + lVar27);
          (*pauVar10)[0] = cVar1;
          cVar2 = *(char *)(lVar13 + lVar27);
          (*pauVar10)[1] = cVar2;
          cVar3 = *(char *)(lVar31 + lVar27);
          (*pauVar10)[2] = cVar3;
          cVar4 = *(char *)(lVar18 + lVar27);
          (*pauVar10)[3] = cVar4;
          cVar5 = *(char *)(lVar21 + 1 + lVar27);
          (*pauVar10)[4] = cVar5;
          iVar14 = iVar14 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          cVar1 = *(char *)(lVar17 + lVar27);
          (*pauVar10)[5] = cVar1;
          cVar2 = *(char *)(lVar31 + 1 + lVar27);
          (*pauVar10)[6] = cVar2;
          cVar3 = *(char *)(lVar15 + lVar27);
          (*pauVar10)[7] = cVar3;
          iVar16 = iVar16 + cVar5 + (int)cVar1 + (int)cVar2 + (int)cVar3;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 8);
          iVar29 = iVar29 + 4;
          lVar21 = lVar21 + lVar34;
          lVar15 = lVar15 + lVar34;
          lVar17 = lVar17 + lVar34;
          lVar18 = lVar18 + lVar34;
          lVar31 = lVar31 + lVar34;
          lVar13 = lVar13 + lVar34;
        } while (iVar29 < max_kk);
        iVar14 = iVar14 * 0x7f;
        iVar16 = iVar16 * 0x7f;
        uVar11 = max_kk & 0xfffffffc;
      }
      puVar26 = (undefined1 *)(lVar21 + lVar27);
      if (3 < max_kk) {
        *(int *)*pauVar10 = iVar14;
        *(int *)(*pauVar10 + 4) = iVar16;
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + 8);
      }
      uVar8 = uVar11 | 1;
      while ((int)uVar8 < max_kk) {
        (*pauVar10)[0] = *puVar26;
        (*pauVar10)[1] = puVar26[lVar9];
        (*pauVar10)[2] = puVar26[1];
        (*pauVar10)[3] = puVar26[iVar7 + 1];
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + 4);
        puVar26 = puVar26 + iVar7 * 2;
        uVar8 = uVar11 + 3;
        uVar11 = uVar11 + 2;
      }
      iVar14 = max_kk - uVar11;
      if (iVar14 != 0 && (int)uVar11 <= max_kk) {
        puVar26 = puVar26 + 1;
        do {
          (*pauVar10)[0] = puVar26[-1];
          (*pauVar10)[1] = *puVar26;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 2);
          puVar26 = puVar26 + lVar9;
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      uVar24 = uVar19 + 2;
      lVar27 = uVar19 + 3;
      lVar28 = lVar28 + 2;
      lVar23 = lVar23 + 2;
      lVar20 = lVar20 + 2;
      lVar30 = lVar30 + 2;
      local_88 = local_88 + 2;
      local_50 = local_50 + 2;
      uVar19 = uVar24;
    } while (lVar27 < lVar32);
  }
  if ((int)uVar24 < max_ii) {
    lVar34 = (long)(iVar7 * 4);
    lVar27 = (long)(int)uVar24;
    lVar28 = lVar27 + lVar22;
    lVar23 = iVar7 * 3 + lVar28;
    lVar30 = iVar7 * 2 + lVar28;
    lVar20 = lVar28 + lVar9;
    do {
      pvVar6 = A->data;
      lVar21 = A->w * lVar12 * A->elemsize;
      if (max_kk < 4) {
        lVar15 = (long)pvVar6 + lVar22 + lVar27;
        uVar11 = 0;
        iVar7 = 0;
      }
      else {
        lVar15 = (long)pvVar6 + lVar28;
        lVar17 = (long)pvVar6 + lVar23;
        lVar18 = (long)pvVar6 + lVar30;
        lVar31 = (long)pvVar6 + lVar20;
        iVar7 = 0;
        iVar14 = 3;
        do {
          cVar1 = *(char *)(lVar15 + lVar21);
          (*pauVar10)[0] = cVar1;
          cVar2 = *(char *)(lVar31 + lVar21);
          (*pauVar10)[1] = cVar2;
          cVar3 = *(char *)(lVar18 + lVar21);
          (*pauVar10)[2] = cVar3;
          cVar4 = *(char *)(lVar17 + lVar21);
          (*pauVar10)[3] = cVar4;
          iVar7 = iVar7 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 4);
          iVar14 = iVar14 + 4;
          lVar15 = lVar15 + lVar34;
          lVar17 = lVar17 + lVar34;
          lVar18 = lVar18 + lVar34;
          lVar31 = lVar31 + lVar34;
        } while (iVar14 < max_kk);
        iVar7 = iVar7 * 0x7f;
        uVar11 = max_kk & 0xfffffffc;
      }
      puVar26 = (undefined1 *)(lVar15 + lVar21);
      if (3 < max_kk) {
        *(int *)*pauVar10 = iVar7;
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + 4);
      }
      iVar7 = max_kk - uVar11;
      if (iVar7 != 0 && (int)uVar11 <= max_kk) {
        do {
          (*pauVar10)[0] = *puVar26;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 1);
          puVar26 = puVar26 + lVar9;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      lVar27 = lVar27 + 1;
      lVar28 = lVar28 + 1;
      lVar23 = lVar23 + 1;
      lVar30 = lVar30 + 1;
      lVar20 = lVar20 + 1;
    } while (lVar27 != lVar32);
  }
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avxvnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}